

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O2

int czhelp_zmsg_readv(zmsg_t *self,char *picture,__va_list_tag *argptr)

{
  char cVar1;
  double *pdVar2;
  size_t *psVar3;
  int *piVar4;
  undefined4 *puVar5;
  undefined1 *puVar6;
  undefined2 *puVar7;
  undefined1 uVar8;
  undefined2 uVar9;
  int iVar10;
  undefined4 uVar11;
  zframe_t *pzVar12;
  char *__nptr;
  size_t sVar13;
  zhashx_t *pzVar14;
  void *__dest;
  long lVar16;
  zuuid_t *self_00;
  byte *pbVar17;
  undefined8 uVar18;
  uint uVar19;
  undefined8 *puVar20;
  long *plVar21;
  undefined8 *puVar22;
  uint uVar23;
  double dVar24;
  zframe_t *curFrame;
  zmsg_t *local_38;
  ulong uVar15;
  
  if (picture == (char *)0x0 || self == (zmsg_t *)0x0) {
    return -1;
  }
  uVar19 = 0;
  local_38 = self;
  do {
    cVar1 = *picture;
    switch(cVar1) {
    case 'b':
      curFrame = zmsg_pop(self);
      uVar23 = argptr->gp_offset;
      uVar15 = (ulong)uVar23;
      if (uVar15 < 0x29) {
        argptr->gp_offset = (uint)(uVar15 + 8);
        puVar22 = *(undefined8 **)((long)argptr->reg_save_area + uVar15);
        if (0x20 < uVar23) goto LAB_002576cf;
        puVar20 = (undefined8 *)(uVar15 + 8 + (long)argptr->reg_save_area);
        argptr->gp_offset = uVar23 + 0x10;
      }
      else {
        puVar22 = (undefined8 *)argptr->overflow_arg_area;
        argptr->overflow_arg_area = puVar22 + 1;
        puVar22 = (undefined8 *)*puVar22;
LAB_002576cf:
        puVar20 = (undefined8 *)argptr->overflow_arg_area;
        argptr->overflow_arg_area = puVar20 + 1;
      }
      if (puVar22 != (undefined8 *)0x0) {
        psVar3 = (size_t *)*puVar20;
        if (curFrame == (zframe_t *)0x0) {
          *puVar22 = 0;
          *psVar3 = 0;
          self = local_38;
        }
        else {
          sVar13 = zframe_size(curFrame);
          *psVar3 = sVar13;
          __dest = malloc(sVar13);
          *puVar22 = __dest;
          pbVar17 = zframe_data(curFrame);
          memcpy(__dest,pbVar17,*psVar3);
          self = local_38;
        }
      }
      goto LAB_00257923;
    case 'c':
      curFrame = zmsg_pop(self);
      uVar23 = argptr->gp_offset;
      if ((ulong)uVar23 < 0x29) {
        plVar21 = (long *)((ulong)uVar23 + (long)argptr->reg_save_area);
        argptr->gp_offset = uVar23 + 8;
      }
      else {
        plVar21 = (long *)argptr->overflow_arg_area;
        argptr->overflow_arg_area = plVar21 + 1;
      }
      puVar22 = (undefined8 *)*plVar21;
      if (puVar22 != (undefined8 *)0x0) {
        if (curFrame == (zframe_t *)0x0) {
LAB_00257861:
          pzVar14 = (zhashx_t *)0x0;
        }
        else {
          pbVar17 = zframe_data(curFrame);
          sVar13 = zframe_size(curFrame);
          pzVar14 = (zhashx_t *)zchunk_new(pbVar17,sVar13);
        }
LAB_00257863:
        *puVar22 = pzVar14;
      }
      goto LAB_00257923;
    case 'd':
      __nptr = zmsg_popstr(self);
      uVar23 = argptr->gp_offset;
      if ((ulong)uVar23 < 0x29) {
        plVar21 = (long *)((ulong)uVar23 + (long)argptr->reg_save_area);
        argptr->gp_offset = uVar23 + 8;
      }
      else {
        plVar21 = (long *)argptr->overflow_arg_area;
        argptr->overflow_arg_area = plVar21 + 1;
      }
      pdVar2 = (double *)*plVar21;
      if (pdVar2 != (double *)0x0) {
        if (__nptr == (char *)0x0) {
          dVar24 = 0.0;
        }
        else {
          dVar24 = strtod(__nptr,(char **)0x0);
        }
        *pdVar2 = dVar24;
      }
      goto LAB_00257914;
    case 'e':
    case 'g':
    case 'j':
    case 'k':
    case 'l':
    case 'm':
    case 'o':
    case 'q':
    case 'r':
    case 't':
    case 'u':
    case 'v':
    case 'w':
    case 'x':
    case 'y':
      goto switchD_002572e9_caseD_65;
    case 'f':
      pzVar12 = zmsg_pop(self);
      uVar23 = argptr->gp_offset;
      if ((ulong)uVar23 < 0x29) {
        plVar21 = (long *)((ulong)uVar23 + (long)argptr->reg_save_area);
        argptr->gp_offset = uVar23 + 8;
      }
      else {
        plVar21 = (long *)argptr->overflow_arg_area;
        argptr->overflow_arg_area = plVar21 + 1;
      }
      puVar22 = (undefined8 *)*plVar21;
      curFrame = pzVar12;
      if (puVar22 == (undefined8 *)0x0) goto LAB_00257923;
LAB_002575d8:
      *puVar22 = pzVar12;
      break;
    case 'h':
      curFrame = zmsg_pop(self);
      uVar23 = argptr->gp_offset;
      if ((ulong)uVar23 < 0x29) {
        plVar21 = (long *)((ulong)uVar23 + (long)argptr->reg_save_area);
        argptr->gp_offset = uVar23 + 8;
      }
      else {
        plVar21 = (long *)argptr->overflow_arg_area;
        argptr->overflow_arg_area = plVar21 + 1;
      }
      puVar22 = (undefined8 *)*plVar21;
      if (puVar22 != (undefined8 *)0x0) {
        if (curFrame == (zframe_t *)0x0) goto LAB_00257861;
        pzVar14 = zhashx_unpack(curFrame);
        goto LAB_00257863;
      }
      goto LAB_00257923;
    case 'i':
      __nptr = zmsg_popstr(self);
      uVar23 = argptr->gp_offset;
      if ((ulong)uVar23 < 0x29) {
        plVar21 = (long *)((ulong)uVar23 + (long)argptr->reg_save_area);
        argptr->gp_offset = uVar23 + 8;
      }
      else {
        plVar21 = (long *)argptr->overflow_arg_area;
        argptr->overflow_arg_area = plVar21 + 1;
      }
      piVar4 = (int *)*plVar21;
      if (piVar4 != (int *)0x0) {
        if (__nptr == (char *)0x0) {
          iVar10 = 0;
        }
        else {
          iVar10 = atoi(__nptr);
        }
        *piVar4 = iVar10;
      }
      goto LAB_00257914;
    case 'n':
      uVar23 = argptr->gp_offset;
      if ((ulong)uVar23 < 0x29) {
        puVar22 = (undefined8 *)((ulong)uVar23 + (long)argptr->reg_save_area);
        argptr->gp_offset = uVar23 + 8;
      }
      else {
        puVar22 = (undefined8 *)argptr->overflow_arg_area;
        argptr->overflow_arg_area = puVar22 + 1;
      }
      plVar21 = (long *)*puVar22;
      binarydata::binarydata((binarydata *)&curFrame);
      CZHelp::zmsg_popNDT(self,(binarydata *)&curFrame);
      (**(code **)(*plVar21 + 0x18))(plVar21);
      std::__cxx11::string::~string((string *)&curFrame);
      break;
    case 'p':
      curFrame = zmsg_pop(self);
      uVar23 = argptr->gp_offset;
      if ((ulong)uVar23 < 0x29) {
        plVar21 = (long *)((ulong)uVar23 + (long)argptr->reg_save_area);
        argptr->gp_offset = uVar23 + 8;
      }
      else {
        plVar21 = (long *)argptr->overflow_arg_area;
        argptr->overflow_arg_area = plVar21 + 1;
      }
      puVar22 = (undefined8 *)*plVar21;
      uVar23 = uVar19;
      if (puVar22 != (undefined8 *)0x0) {
        if (curFrame == (zframe_t *)0x0) {
          uVar18 = 0;
        }
        else {
          sVar13 = zframe_size(curFrame);
          uVar23 = 0xffffffff;
          if (sVar13 != 8) goto LAB_002578e4;
          pbVar17 = zframe_data(curFrame);
          uVar18 = *(undefined8 *)pbVar17;
        }
        *puVar22 = uVar18;
        uVar23 = uVar19;
      }
LAB_002578e4:
      zframe_destroy(&curFrame);
      uVar19 = uVar23;
      break;
    case 's':
      pzVar12 = (zframe_t *)zmsg_popstr(self);
      uVar23 = argptr->gp_offset;
      if ((ulong)uVar23 < 0x29) {
        plVar21 = (long *)((ulong)uVar23 + (long)argptr->reg_save_area);
        argptr->gp_offset = uVar23 + 8;
      }
      else {
        plVar21 = (long *)argptr->overflow_arg_area;
        argptr->overflow_arg_area = plVar21 + 1;
      }
      puVar22 = (undefined8 *)*plVar21;
      if (puVar22 != (undefined8 *)0x0) goto LAB_002575d8;
      break;
    case 'z':
      curFrame = zmsg_pop(self);
      if (curFrame != (zframe_t *)0x0) {
        sVar13 = zframe_size(curFrame);
        uVar19 = uVar19 | -(uint)(sVar13 != 0);
      }
LAB_00257923:
      zframe_destroy(&curFrame);
      break;
    default:
      switch(cVar1) {
      case '1':
        __nptr = zmsg_popstr(self);
        uVar23 = argptr->gp_offset;
        if ((ulong)uVar23 < 0x29) {
          plVar21 = (long *)((ulong)uVar23 + (long)argptr->reg_save_area);
          argptr->gp_offset = uVar23 + 8;
        }
        else {
          plVar21 = (long *)argptr->overflow_arg_area;
          argptr->overflow_arg_area = plVar21 + 1;
        }
        puVar6 = (undefined1 *)*plVar21;
        if (puVar6 != (undefined1 *)0x0) {
          if (__nptr == (char *)0x0) {
            uVar8 = 0;
          }
          else {
            iVar10 = atoi(__nptr);
            uVar8 = (undefined1)iVar10;
          }
          *puVar6 = uVar8;
        }
        break;
      case '2':
        __nptr = zmsg_popstr(self);
        uVar23 = argptr->gp_offset;
        if ((ulong)uVar23 < 0x29) {
          plVar21 = (long *)((ulong)uVar23 + (long)argptr->reg_save_area);
          argptr->gp_offset = uVar23 + 8;
        }
        else {
          plVar21 = (long *)argptr->overflow_arg_area;
          argptr->overflow_arg_area = plVar21 + 1;
        }
        puVar7 = (undefined2 *)*plVar21;
        if (puVar7 != (undefined2 *)0x0) {
          if (__nptr == (char *)0x0) {
            uVar9 = 0;
          }
          else {
            lVar16 = atol(__nptr);
            uVar9 = (undefined2)lVar16;
          }
          *puVar7 = uVar9;
        }
        break;
      case '3':
      case '5':
      case '6':
      case '7':
        goto switchD_002572e9_caseD_65;
      case '4':
        __nptr = zmsg_popstr(self);
        uVar23 = argptr->gp_offset;
        if ((ulong)uVar23 < 0x29) {
          plVar21 = (long *)((ulong)uVar23 + (long)argptr->reg_save_area);
          argptr->gp_offset = uVar23 + 8;
        }
        else {
          plVar21 = (long *)argptr->overflow_arg_area;
          argptr->overflow_arg_area = plVar21 + 1;
        }
        puVar5 = (undefined4 *)*plVar21;
        if (puVar5 != (undefined4 *)0x0) {
          if (__nptr == (char *)0x0) {
            uVar11 = 0;
          }
          else {
            uVar15 = strtoul(__nptr,(char **)0x0,10);
            uVar11 = (undefined4)uVar15;
          }
          *puVar5 = uVar11;
        }
        break;
      case '8':
        __nptr = zmsg_popstr(self);
        uVar23 = argptr->gp_offset;
        if ((ulong)uVar23 < 0x29) {
          plVar21 = (long *)((ulong)uVar23 + (long)argptr->reg_save_area);
          argptr->gp_offset = uVar23 + 8;
        }
        else {
          plVar21 = (long *)argptr->overflow_arg_area;
          argptr->overflow_arg_area = plVar21 + 1;
        }
        plVar21 = (long *)*plVar21;
        if (plVar21 != (long *)0x0) {
          if (__nptr == (char *)0x0) {
            lVar16 = 0;
          }
          else {
            iVar10 = atoi(__nptr);
            lVar16 = (long)iVar10;
          }
          *plVar21 = lVar16;
        }
        break;
      default:
        if (cVar1 == 'U') {
          curFrame = zmsg_pop(self);
          uVar23 = argptr->gp_offset;
          if ((ulong)uVar23 < 0x29) {
            puVar22 = (undefined8 *)((ulong)uVar23 + (long)argptr->reg_save_area);
            argptr->gp_offset = uVar23 + 8;
          }
          else {
            puVar22 = (undefined8 *)argptr->overflow_arg_area;
            argptr->overflow_arg_area = puVar22 + 1;
          }
          puVar22 = (undefined8 *)*puVar22;
          if (puVar22 != (undefined8 *)0x0) {
            if (curFrame == (zframe_t *)0x0) {
              *puVar22 = 0;
            }
            else {
              self_00 = zuuid_new();
              *puVar22 = self_00;
              pbVar17 = zframe_data(curFrame);
              zuuid_set(self_00,pbVar17);
            }
          }
          goto LAB_00257923;
        }
        if (cVar1 == '\0') {
          return uVar19;
        }
        goto switchD_002572e9_caseD_65;
      }
LAB_00257914:
      free(__nptr);
    }
LAB_0025792b:
    picture = picture + 1;
  } while( true );
switchD_002572e9_caseD_65:
  std::operator<<((ostream *)&std::cout,
                  "ERROR: formated data type not supported. (CZHelp::zmsg_read)\n");
  goto LAB_0025792b;
}

Assistant:

int czhelp_zmsg_readv(zmsg_t* self, const char* picture, va_list argptr) {
    int retval = -1;
    if (self == NULL || picture == NULL)
        return(retval);
    retval = 0;
    while(*picture) {
        if (*picture == 'i') { //int
            char *str = zmsg_popstr(self);
            int *val = va_arg(argptr, int *); //retrieve int from the input list of argumetns
            if (val)
                *val = str? atoi (str): 0;
            freen(str);

        }
        else if (*picture == '1') { //uint8_t
            char *str = zmsg_popstr (self);
            uint8_t *val = va_arg (argptr, uint8_t *);
            if (val)
                *val = str? (uint8_t) atoi (str): 0;
            freen(str);
        }
        else if (*picture == '2') { //uint16_t
            char *str = zmsg_popstr (self);
            uint16_t *val = va_arg (argptr, uint16_t *);
            if (val)
                *val = str? (uint16_t) atol (str): 0;
            freen(str);
        }
        else if (*picture == '4') { //uint32_t
            char *str = zmsg_popstr (self);
            uint32_t *val = va_arg (argptr, uint32_t *);
            if (val)
                *val = str? (uint32_t) strtoul(str, NULL, 10): 0;
            freen(str);
        }
        else if (*picture == '8') { //uint64_t
            char *str = zmsg_popstr (self);
            uint64_t *val = va_arg (argptr, uint64_t *);
            if (val)
                *val = str? (uint64_t) atoi (str): 0;
            freen(str);
        }
        else if (*picture == 'd') {
            char *str = zmsg_popstr(self);
            double *val = va_arg(argptr, double *);
            if (val)
                *val = str ? (double) strtod(str, NULL) : 0;
            freen(str);
        }
        else if (*picture == 's') { //string
            char *str = zmsg_popstr(self);
            char **val = va_arg(argptr, char **);
            if (val) {
                *val = str;
            }
        }
        else if (*picture == 'b') { //byte *, size_t (2 args)
            zframe_t *curFrame = zmsg_pop (self);
            byte **data_p = va_arg (argptr, byte **);
            size_t *size = va_arg (argptr, size_t *);
            if (data_p) {
                if (curFrame) {
                    *size = zframe_size (curFrame);
                    *data_p = (byte *) malloc (*size);
                    memcpy (*data_p, zframe_data (curFrame), *size);
                }
                else {
                    *data_p = NULL;
                    *size = 0;
                }
            }
            zframe_destroy (&curFrame);
        }
        else if (*picture == 'c') { //zchunk_t *
            zframe_t *curFrame = zmsg_pop (self);
            zchunk_t **val = va_arg (argptr, zchunk_t **);
            if (val) {
                if (curFrame)
                    *val = zchunk_new (zframe_data (curFrame), zframe_size (curFrame));
                else
                    *val = NULL;
            }
            zframe_destroy (&curFrame);
        }
        else if (*picture == 'f') { //zframe_t *
            zframe_t *curFrame = zmsg_pop (self);
            zframe_t **val = va_arg (argptr, zframe_t **);
            if (val)
                *val = curFrame;
            else
                zframe_destroy (&curFrame);
        }
        else if (*picture == 'U') { //zuuid_t *
            zframe_t *curFrame = zmsg_pop (self);
            zuuid_t **val = va_arg (argptr, zuuid_t **);
            if (val) {
                if (curFrame) {
                    *val = zuuid_new ();
                    zuuid_set (*val, zframe_data (curFrame));
                }
                else
                    *val = NULL;
            }
            zframe_destroy (&curFrame);
        }
        else if (*picture == 'p') { //void *
            zframe_t *curFrame = zmsg_pop (self);
            void **val = va_arg (argptr, void **);
            if (val) {
                if (curFrame) {
                    if (zframe_size (curFrame) == sizeof (void *))
                        *val = *((void **) zframe_data (curFrame));
                    else
                        retval = -1;
                }
                else
                    *val = NULL;
            }
            zframe_destroy (&curFrame);
        }
        else if (*picture == 'h') { //zhashx_t *
            zframe_t *curFrame = zmsg_pop (self);
            zhashx_t **val = va_arg (argptr, zhashx_t **);
            if (val) {
                if (curFrame)
                    *val = zhashx_unpack (curFrame);
                else
                    *val = NULL;
            }
            zframe_destroy (&curFrame);
        }
        else if (*picture == 'n') { //NetworkDataType
            NetworkDataType *val = va_arg(argptr, NetworkDataType *);
            binarydata dat;
            CZHelp::zmsg_popNDT(self, dat);
            val->decode(dat);
        }
        else if (*picture == 'z') { //sends zero-frame (0 args)
            zframe_t *curFrame = zmsg_pop (self);
            if (curFrame && zframe_size (curFrame) != 0)
                retval = -1;
            zframe_destroy (&curFrame);
        }
        else {
            std::cout << "ERROR: formated data type not supported. (CZHelp::zmsg_read)\n";
        }
        picture++;
    }
    return(retval);
}